

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O0

void __thiscall duckdb_parquet::LogicalType::LogicalType(LogicalType *this,LogicalType *other52)

{
  undefined1 uVar1;
  TimeType *in_RSI;
  TimeType *in_RDI;
  
  duckdb_apache::thrift::TBase::TBase((TBase *)in_RDI);
  *(undefined ***)in_RDI = &PTR__LogicalType_00c01890;
  *(undefined ***)in_RDI = &PTR__LogicalType_00c01890;
  StringType::StringType((StringType *)in_RSI);
  MapType::MapType((MapType *)in_RSI);
  ListType::ListType((ListType *)in_RSI);
  EnumType::EnumType((EnumType *)in_RSI);
  DecimalType::DecimalType((DecimalType *)in_RSI);
  DateType::DateType((DateType *)in_RSI);
  TimeType::TimeType(in_RSI);
  TimestampType::TimestampType((TimestampType *)in_RSI);
  IntType::IntType((IntType *)in_RSI);
  NullType::NullType((NullType *)in_RSI);
  JsonType::JsonType((JsonType *)in_RSI);
  BsonType::BsonType((BsonType *)in_RSI);
  UUIDType::UUIDType((UUIDType *)in_RSI);
  Float16Type::Float16Type((Float16Type *)in_RSI);
  _LogicalType__isset::_LogicalType__isset((_LogicalType__isset *)&in_RDI[4].isAdjustedToUTC);
  StringType::operator=
            ((StringType *)&in_RDI->isAdjustedToUTC,
             (StringType *)&((TimestampType *)in_RSI)->isAdjustedToUTC);
  MapType::operator=((MapType *)&in_RDI->unit,(MapType *)&((TimestampType *)in_RSI)->unit);
  ListType::operator=((ListType *)&(in_RDI->unit).MILLIS,
                      (ListType *)&(((TimestampType *)in_RSI)->unit).MILLIS);
  EnumType::operator=((EnumType *)&(in_RDI->unit).MICROS,
                      (EnumType *)&(((TimestampType *)in_RSI)->unit).MICROS);
  DecimalType::operator=
            ((DecimalType *)&(in_RDI->unit).NANOS,
             (DecimalType *)&(((TimestampType *)in_RSI)->unit).NANOS);
  DateType::operator=((DateType *)(in_RDI + 1),(DateType *)((TimestampType *)in_RSI + 1));
  TimeType::operator=(in_RSI,in_RDI);
  TimestampType::operator=((TimestampType *)in_RSI,(TimestampType *)in_RDI);
  IntType::operator=((IntType *)&((TimestampType *)in_RDI)[3].isAdjustedToUTC,
                     (IntType *)&((TimestampType *)in_RSI)[3].isAdjustedToUTC);
  NullType::operator=((NullType *)&((TimestampType *)in_RDI)[3].unit.MILLIS,
                      (NullType *)&((TimestampType *)in_RSI)[3].unit.MILLIS);
  JsonType::operator=((JsonType *)&((TimestampType *)in_RDI)[3].unit.MICROS,
                      (JsonType *)&((TimestampType *)in_RSI)[3].unit.MICROS);
  BsonType::operator=((BsonType *)&((TimestampType *)in_RDI)[3].unit.NANOS,
                      (BsonType *)&((TimestampType *)in_RSI)[3].unit.NANOS);
  UUIDType::operator=((UUIDType *)&((TimestampType *)in_RDI)[3].unit.__isset,
                      (UUIDType *)&((TimestampType *)in_RSI)[3].unit.__isset);
  Float16Type::operator=
            ((Float16Type *)((TimestampType *)in_RDI + 4),
             (Float16Type *)((TimestampType *)in_RSI + 4));
  uVar1 = ((TimestampType *)in_RSI)[4].field_0x9;
  ((TimestampType *)in_RDI)[4].isAdjustedToUTC = ((TimestampType *)in_RSI)[4].isAdjustedToUTC;
  ((TimestampType *)in_RDI)[4].field_0x9 = uVar1;
  return;
}

Assistant:

LogicalType::LogicalType(const LogicalType& other52) noexcept {
  STRING = other52.STRING;
  MAP = other52.MAP;
  LIST = other52.LIST;
  ENUM = other52.ENUM;
  DECIMAL = other52.DECIMAL;
  DATE = other52.DATE;
  TIME = other52.TIME;
  TIMESTAMP = other52.TIMESTAMP;
  INTEGER = other52.INTEGER;
  UNKNOWN = other52.UNKNOWN;
  JSON = other52.JSON;
  BSON = other52.BSON;
  UUID = other52.UUID;
  FLOAT16 = other52.FLOAT16;
  __isset = other52.__isset;
}